

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20.c
# Opt level: O3

void Hacl_Impl_Chacha20_chacha20_init(uint32_t *ctx,uint8_t *k,uint8_t *n,uint32_t ctr)

{
  ctx[0] = 0x61707865;
  ctx[1] = 0x3320646e;
  ctx[2] = 0x79622d32;
  ctx[3] = 0x6b206574;
  ctx[4] = *(uint32_t *)k;
  ctx[5] = *(uint32_t *)(k + 4);
  ctx[6] = *(uint32_t *)(k + 8);
  ctx[7] = *(uint32_t *)(k + 0xc);
  ctx[8] = *(uint32_t *)(k + 0x10);
  ctx[9] = *(uint32_t *)(k + 0x14);
  ctx[10] = *(uint32_t *)(k + 0x18);
  ctx[0xb] = *(uint32_t *)(k + 0x1c);
  ctx[0xc] = ctr;
  ctx[0xd] = *(uint32_t *)n;
  ctx[0xe] = *(uint32_t *)(n + 4);
  ctx[0xf] = *(uint32_t *)(n + 8);
  return;
}

Assistant:

void Hacl_Impl_Chacha20_chacha20_init(uint32_t *ctx, uint8_t *k, uint8_t *n, uint32_t ctr)
{
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint32_t *os = ctx;
    uint32_t x = chacha20_constants[i];
    os[i] = x;);
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t *os = ctx + 4U;
    uint8_t *bj = k + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  ctx[12U] = ctr;
  KRML_MAYBE_FOR3(i,
    0U,
    3U,
    1U,
    uint32_t *os = ctx + 13U;
    uint8_t *bj = n + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
}